

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall ON_RTree::CreateMeshFaceTree(ON_RTree *this,ON_Mesh *mesh)

{
  int iVar1;
  Blk *pBVar2;
  ON_MeshFace *pOVar3;
  ON_3fPoint *pOVar4;
  ON_3dPoint *pOVar5;
  undefined1 auVar6 [16];
  undefined1 *puVar7;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  bool bVar10;
  ON_3dPointArray *pOVar11;
  double *pdVar12;
  double *pdVar13;
  Blk *pBVar14;
  int *piVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [8];
  double dVar29;
  ON_3dPoint V;
  ON_3dPoint local_d8;
  double local_b8;
  double local_b0;
  undefined8 local_a8;
  double local_a0;
  undefined1 local_98 [8];
  double dStack_90;
  double local_88 [2];
  undefined1 local_78 [8];
  double dStack_70;
  double local_68 [2];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  ulong local_38;
  
  this->m_root = (ON_RTreeNode *)0x0;
  pBVar14 = (this->m_mem_pool).m_blk_list;
  if (pBVar14 != (Blk *)0x0) {
    (this->m_mem_pool).m_blk_list = (Blk *)0x0;
    (this->m_mem_pool).m_sizeof_blk = 0;
    (this->m_mem_pool).m_buffer = (uchar *)0x0;
    (this->m_mem_pool).m_buffer_capacity = 0;
    (this->m_mem_pool).m_nodes = (Blk *)0x0;
    (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
    (this->m_mem_pool).m_sizeof_heap = 0;
    do {
      pBVar2 = pBVar14->m_next;
      onfree(pBVar14);
      pBVar14 = pBVar2;
    } while (pBVar2 != (Blk *)0x0);
  }
  if (((mesh == (ON_Mesh *)0x0) || (local_38 = (ulong)(uint)(mesh->m_F).m_count, local_38 == 0)) ||
     (pOVar3 = (mesh->m_F).m_a, pOVar3 == (ON_MeshFace *)0x0)) {
LAB_005a517d:
    bVar10 = false;
  }
  else {
    pOVar4 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    bVar10 = ON_Mesh::HasDoublePrecisionVertices(mesh);
    if (bVar10) {
      pOVar11 = ON_Mesh::DoublePrecisionVertices(mesh);
      pOVar5 = (pOVar11->super_ON_SimpleArray<ON_3dPoint>).m_a;
      if (pOVar4 == (ON_3fPoint *)0x0) {
        if (pOVar5 == (ON_3dPoint *)0x0) goto LAB_005a517d;
        pdVar13 = (double *)(local_78 + 8);
        piVar15 = pOVar3->vi + 3;
        uVar16 = 0;
        do {
          local_78 = (undefined1  [8])pOVar5[((ON_MeshFace *)(piVar15 + -3))->vi[0]].x;
          dVar23 = pOVar5[((ON_MeshFace *)(piVar15 + -3))->vi[0]].y;
          dVar21 = pOVar5[((ON_MeshFace *)(piVar15 + -3))->vi[0]].z;
          uVar17 = SUB84(dVar21,0);
          uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
          local_98 = (undefined1  [8])pOVar5[piVar15[-2]].x;
          dVar22 = pOVar5[piVar15[-2]].y;
          dVar24 = pOVar5[piVar15[-2]].z;
          uVar26 = SUB84(local_98,0);
          uVar27 = (undefined4)((ulong)local_98 >> 0x20);
          dVar25 = (double)local_98;
          if (((double)local_98 < (double)local_78) ||
             (dVar25 = (double)local_78, (double)local_98 <= (double)local_78)) {
            uVar26 = SUB84(local_78,0);
            uVar27 = (undefined4)((ulong)local_78 >> 0x20);
            local_98 = local_78;
            local_78 = (undefined1  [8])dVar25;
          }
          auVar9 = local_78;
          local_88[0] = dVar21;
          local_68[0] = dVar21;
          dStack_70 = dVar23;
          if (dVar23 <= dVar22) {
            pdVar12 = (double *)(local_98 + 8);
            uVar18 = SUB84(dVar22,0);
            uVar20 = (undefined4)((ulong)dVar22 >> 0x20);
            dVar25 = dVar23;
            dVar29 = dVar23;
            if (dVar23 < dVar22) goto LAB_005a4f69;
          }
          else {
            uVar18 = SUB84(dVar23,0);
            uVar20 = (undefined4)((ulong)dVar23 >> 0x20);
            pdVar12 = pdVar13;
            dVar25 = dVar22;
LAB_005a4f69:
            *pdVar12 = dVar22;
            dVar29 = (double)CONCAT44(uVar20,uVar18);
          }
          uVar18 = SUB84(dVar24,0);
          uVar20 = (undefined4)((ulong)dVar24 >> 0x20);
          pdVar12 = local_68;
          dVar22 = dVar21;
          if ((dVar24 < dVar21) ||
             (pdVar12 = local_88, uVar18 = uVar17, uVar20 = uVar19, dVar22 = dVar24, dVar21 < dVar24
             )) {
            dVar21 = dVar22;
            *pdVar12 = dVar24;
            uVar17 = uVar18;
            uVar19 = uVar20;
          }
          local_d8.x = pOVar5[piVar15[-1]].x;
          local_d8.y = pOVar5[piVar15[-1]].y;
          local_d8.z = pOVar5[piVar15[-1]].z;
          auVar28 = (undefined1  [8])local_d8.x;
          auVar8 = (undefined1  [8])local_d8.x;
          if (((double)auVar9 <= local_d8.x) &&
             (auVar28 = auVar9, auVar8 = local_78,
             (double)CONCAT44(uVar27,uVar26) <= local_d8.x &&
             local_d8.x != (double)CONCAT44(uVar27,uVar26))) {
            uVar26 = SUB84(local_d8.x,0);
            uVar27 = (int)((ulong)local_d8.x >> 0x20);
            local_98 = (undefined1  [8])local_d8.x;
          }
          local_78 = auVar8;
          pdVar12 = pdVar13;
          dVar24 = local_d8.y;
          dVar22 = dVar29;
          dStack_90 = dVar23;
          if ((local_d8.y < dVar25) ||
             (pdVar12 = (double *)(local_98 + 8), dVar24 = dVar25, dVar22 = local_d8.y,
             dVar29 < local_d8.y)) {
            dVar29 = dVar22;
            *pdVar12 = local_d8.y;
            dVar25 = dVar24;
          }
          uVar18 = SUB84(local_d8.z,0);
          uVar20 = (undefined4)((ulong)local_d8.z >> 0x20);
          pdVar12 = local_68;
          dVar24 = dVar21;
          if ((local_d8.z <= (double)CONCAT44(uVar19,uVar17) &&
               (double)CONCAT44(uVar19,uVar17) != local_d8.z) ||
             (pdVar12 = local_88, uVar18 = uVar17, uVar20 = uVar19, dVar24 = local_d8.z,
             dVar21 < local_d8.z)) {
            dVar21 = dVar24;
            *pdVar12 = local_d8.z;
            uVar17 = uVar18;
            uVar19 = uVar20;
          }
          iVar1 = *piVar15;
          if (piVar15[-1] != iVar1) {
            local_d8.x = pOVar5[iVar1].x;
            local_d8.y = pOVar5[iVar1].y;
            local_d8.z = pOVar5[iVar1].z;
            auVar9 = (undefined1  [8])local_d8.x;
            if (((double)auVar28 <= local_d8.x) &&
               (auVar9 = local_78,
               (double)CONCAT44(uVar27,uVar26) <= local_d8.x &&
               local_d8.x != (double)CONCAT44(uVar27,uVar26))) {
              local_98 = (undefined1  [8])local_d8.x;
            }
            local_78 = auVar9;
            pdVar12 = pdVar13;
            if ((local_d8.y < dVar25) || (pdVar12 = (double *)(local_98 + 8), dVar29 < local_d8.y))
            {
              *pdVar12 = local_d8.y;
            }
            pdVar12 = local_68;
            if ((local_d8.z <= (double)CONCAT44(uVar19,uVar17) &&
                 (double)CONCAT44(uVar19,uVar17) != local_d8.z) ||
               (pdVar12 = local_88, dVar21 < local_d8.z)) {
              *pdVar12 = local_d8.z;
            }
          }
          bVar10 = Insert(this,(double *)local_78,(double *)local_98,(int)uVar16);
          if (!bVar10) {
            this->m_root = (ON_RTreeNode *)0x0;
            pBVar14 = (this->m_mem_pool).m_blk_list;
            if (pBVar14 != (Blk *)0x0) {
              (this->m_mem_pool).m_blk_list = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_blk = 0;
              (this->m_mem_pool).m_buffer = (uchar *)0x0;
              (this->m_mem_pool).m_buffer_capacity = 0;
              (this->m_mem_pool).m_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_heap = 0;
              do {
                pBVar2 = pBVar14->m_next;
                onfree(pBVar14);
                pBVar14 = pBVar2;
              } while (pBVar2 != (Blk *)0x0);
              return false;
            }
            goto LAB_005a517d;
          }
          uVar16 = uVar16 + 1;
          piVar15 = piVar15 + 4;
        } while (local_38 != uVar16);
      }
      else {
        if (pOVar5 == (ON_3dPoint *)0x0) goto LAB_005a4b09;
        pdVar13 = (double *)(local_98 + 8);
        piVar15 = pOVar3->vi + 3;
        uVar16 = 0;
        do {
          ON_3dPoint::operator=(&local_d8,pOVar4 + ((ON_MeshFace *)(piVar15 + -3))->vi[0]);
          auVar6._8_8_ = local_d8.y;
          auVar6._0_8_ = local_d8.x;
          uVar17 = SUB84(local_d8.z,0);
          uVar19 = (undefined4)((ulong)local_d8.z >> 0x20);
          local_88[0] = local_d8.z;
          local_68[0] = local_d8.z;
          dVar24 = pOVar5[((ON_MeshFace *)(piVar15 + -3))->vi[0]].x;
          dVar23 = pOVar5[((ON_MeshFace *)(piVar15 + -3))->vi[0]].y;
          dVar21 = pOVar5[((ON_MeshFace *)(piVar15 + -3))->vi[0]].z;
          local_a0 = local_d8.x;
          _local_98 = auVar6;
          if (local_d8.x <= dVar24) {
            _local_78 = auVar6;
            if (local_d8.x < dVar24) {
              dStack_90 = local_d8.y;
              local_98 = (undefined1  [8])dVar24;
              local_a0 = dVar24;
            }
          }
          else {
            dStack_70 = local_d8.y;
            local_78 = (undefined1  [8])dVar24;
            local_d8.x = dVar24;
          }
          if (local_d8.y <= dVar23) {
            local_a8._0_4_ = SUB84(local_d8.y,0);
            local_a8._4_4_ = (undefined4)((ulong)local_d8.y >> 0x20);
            pdVar12 = pdVar13;
            dVar22 = dVar23;
            dStack_50 = local_d8.y;
            if (local_d8.y < dVar23) goto LAB_005a4583;
          }
          else {
            pdVar12 = (double *)(local_78 + 8);
            dVar22 = local_d8.y;
            local_d8.y = dVar23;
            dStack_50 = 0.0;
LAB_005a4583:
            *pdVar12 = dVar23;
            local_a8._0_4_ = SUB84(dVar22,0);
            local_a8._4_4_ = (undefined4)((ulong)dVar22 >> 0x20);
          }
          local_58 = local_d8.y;
          if (local_d8.z <= dVar21) {
            pdVar12 = local_88;
            local_b8 = local_d8.z;
            dVar22 = dVar21;
            if (local_d8.z < dVar21) goto LAB_005a45db;
          }
          else {
            pdVar12 = local_68;
            dVar22 = local_d8.z;
            local_b8 = dVar21;
LAB_005a45db:
            *pdVar12 = dVar21;
            uVar17 = SUB84(dVar22,0);
            uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
          }
          local_b0 = (double)CONCAT44(uVar19,uVar17);
          local_48 = local_d8.x;
          local_d8.x = dVar24;
          local_d8.y = dVar23;
          local_d8.z = dVar21;
          ON_3dPoint::operator=(&local_d8,pOVar4 + piVar15[-2]);
          uVar17 = (undefined4)((ulong)local_b8 >> 0x20);
          if (local_48 <= local_d8.x) {
            if (local_a0 < local_d8.x) {
              local_98 = (undefined1  [8])local_d8.x;
              local_a0 = local_d8.x;
            }
          }
          else {
            local_78 = (undefined1  [8])local_d8.x;
            local_48 = local_d8.x;
          }
          uVar19 = SUB84(local_b8,0);
          if (local_58 <= local_d8.y) {
            pdVar12 = pdVar13;
            dVar21 = local_d8.y;
            dVar24 = local_58;
            if ((double)CONCAT44(local_a8._4_4_,(undefined4)local_a8) <= local_d8.y &&
                local_d8.y != (double)CONCAT44(local_a8._4_4_,(undefined4)local_a8))
            goto LAB_005a4699;
          }
          else {
            dStack_50 = 0.0;
            pdVar12 = (double *)(local_78 + 8);
            dVar21 = (double)CONCAT44(local_a8._4_4_,(undefined4)local_a8);
            dVar24 = local_d8.y;
LAB_005a4699:
            *pdVar12 = local_d8.y;
            local_a8._0_4_ = SUB84(dVar21,0);
            local_a8._4_4_ = (undefined4)((ulong)dVar21 >> 0x20);
          }
          if (local_b8 <= local_d8.z) {
            pdVar12 = local_88;
            dVar21 = local_d8.z;
            if (local_b0 < local_d8.z) goto LAB_005a46cb;
          }
          else {
            pdVar12 = local_68;
            uVar19 = SUB84(local_d8.z,0);
            uVar17 = (undefined4)((ulong)local_d8.z >> 0x20);
            dVar21 = local_b0;
LAB_005a46cb:
            *pdVar12 = local_d8.z;
            local_b0 = dVar21;
          }
          local_d8.x = pOVar5[piVar15[-2]].x;
          local_d8.y = pOVar5[piVar15[-2]].y;
          local_d8.z = pOVar5[piVar15[-2]].z;
          if (local_48 <= local_d8.x) {
            if (local_a0 < local_d8.x) {
              local_98 = (undefined1  [8])local_d8.x;
              local_a0 = local_d8.x;
            }
          }
          else {
            local_78 = (undefined1  [8])local_d8.x;
            local_48 = local_d8.x;
          }
          if (dVar24 <= local_d8.y) {
            pdVar12 = pdVar13;
            dVar21 = local_d8.y;
            if ((double)CONCAT44(local_a8._4_4_,(undefined4)local_a8) <= local_d8.y &&
                local_d8.y != (double)CONCAT44(local_a8._4_4_,(undefined4)local_a8))
            goto LAB_005a473e;
          }
          else {
            dStack_50 = 0.0;
            pdVar12 = (double *)(local_78 + 8);
            dVar21 = (double)CONCAT44(local_a8._4_4_,(undefined4)local_a8);
            dVar24 = local_d8.y;
LAB_005a473e:
            *pdVar12 = local_d8.y;
            local_a8._0_4_ = SUB84(dVar21,0);
            local_a8._4_4_ = (undefined4)((ulong)dVar21 >> 0x20);
          }
          local_58 = dVar24;
          if ((double)CONCAT44(uVar17,uVar19) < local_d8.z ||
              (double)CONCAT44(uVar17,uVar19) == local_d8.z) {
            local_b8 = (double)CONCAT44(uVar17,uVar19);
            pdVar12 = local_88;
            dVar21 = local_d8.z;
            if (local_b0 < local_d8.z) goto LAB_005a4796;
          }
          else {
            pdVar12 = local_68;
            dVar21 = local_b0;
            local_b8 = local_d8.z;
LAB_005a4796:
            *pdVar12 = local_d8.z;
            local_b0 = dVar21;
          }
          ON_3dPoint::operator=(&local_d8,pOVar4 + piVar15[-1]);
          uVar17 = (undefined4)((ulong)local_b8 >> 0x20);
          uVar19 = (undefined4)((ulong)local_a8 >> 0x20);
          dVar21 = local_a0;
          if (local_48 <= local_d8.x) {
            dVar24 = local_48;
            if (local_a0 < local_d8.x) {
              local_98 = (undefined1  [8])local_d8.x;
              dVar21 = local_d8.x;
            }
          }
          else {
            local_78 = (undefined1  [8])local_d8.x;
            dVar24 = local_d8.x;
          }
          uVar27 = SUB84(local_a8,0);
          uVar26 = SUB84(local_b8,0);
          if (local_58 <= local_d8.y) {
            pdVar12 = pdVar13;
            dVar22 = local_d8.y;
            dVar25 = local_58;
            dVar23 = dStack_50;
            if (local_a8 < local_d8.y) goto LAB_005a4854;
          }
          else {
            pdVar12 = (double *)(local_78 + 8);
            dVar22 = local_a8;
            dVar25 = local_d8.y;
            dVar23 = 0.0;
LAB_005a4854:
            *pdVar12 = local_d8.y;
            uVar27 = SUB84(dVar22,0);
            uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
          }
          if (local_b8 <= local_d8.z) {
            pdVar12 = local_88;
            dVar22 = local_d8.z;
            dVar29 = local_b0;
            if (local_b0 < local_d8.z) goto LAB_005a4886;
          }
          else {
            pdVar12 = local_68;
            uVar26 = SUB84(local_d8.z,0);
            uVar17 = (undefined4)((ulong)local_d8.z >> 0x20);
            dVar22 = local_b0;
LAB_005a4886:
            *pdVar12 = local_d8.z;
            dVar29 = dVar22;
          }
          local_d8.x = pOVar5[piVar15[-1]].x;
          local_d8.y = pOVar5[piVar15[-1]].y;
          local_d8.z = pOVar5[piVar15[-1]].z;
          if (dVar24 <= local_d8.x) {
            if (dVar21 < local_d8.x) {
              local_98 = (undefined1  [8])local_d8.x;
              dVar21 = local_d8.x;
            }
          }
          else {
            local_78 = (undefined1  [8])local_d8.x;
            dVar24 = local_d8.x;
          }
          if (dVar25 <= local_d8.y) {
            pdVar12 = pdVar13;
            dVar22 = local_d8.y;
            if ((double)CONCAT44(uVar19,uVar27) <= local_d8.y &&
                local_d8.y != (double)CONCAT44(uVar19,uVar27)) goto LAB_005a48f9;
          }
          else {
            dVar23 = 0.0;
            pdVar12 = (double *)(local_78 + 8);
            dVar22 = (double)CONCAT44(uVar19,uVar27);
            dVar25 = local_d8.y;
LAB_005a48f9:
            *pdVar12 = local_d8.y;
            uVar27 = SUB84(dVar22,0);
            uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
          }
          if ((double)CONCAT44(uVar17,uVar26) < local_d8.z ||
              (double)CONCAT44(uVar17,uVar26) == local_d8.z) {
            pdVar12 = local_88;
            dVar22 = local_d8.z;
            if (dVar29 < local_d8.z) goto LAB_005a492b;
          }
          else {
            pdVar12 = local_68;
            uVar26 = SUB84(local_d8.z,0);
            uVar17 = (undefined4)((ulong)local_d8.z >> 0x20);
            dVar22 = dVar29;
LAB_005a492b:
            *pdVar12 = local_d8.z;
            dVar29 = dVar22;
          }
          if (piVar15[-1] != *piVar15) {
            local_a8 = (double)CONCAT44(uVar19,uVar27);
            local_b8 = (double)CONCAT44(uVar17,uVar26);
            local_b0 = dVar29;
            local_a0 = dVar21;
            local_58 = dVar25;
            dStack_50 = dVar23;
            local_48 = dVar24;
            ON_3dPoint::operator=(&local_d8,pOVar4 + *piVar15);
            uVar17 = (undefined4)((ulong)local_b8 >> 0x20);
            uVar19 = (undefined4)((ulong)local_a8 >> 0x20);
            dVar21 = local_a0;
            if (local_48 <= local_d8.x) {
              dVar24 = local_48;
              if (local_a0 < local_d8.x) {
                local_98 = (undefined1  [8])local_d8.x;
                dVar21 = local_d8.x;
              }
            }
            else {
              local_78 = (undefined1  [8])local_d8.x;
              dVar24 = local_d8.x;
            }
            uVar27 = SUB84(local_a8,0);
            uVar26 = SUB84(local_b8,0);
            if (local_58 <= local_d8.y) {
              pdVar12 = pdVar13;
              dVar23 = local_d8.y;
              dVar22 = local_58;
              if (local_a8 < local_d8.y) goto LAB_005a4a17;
            }
            else {
              pdVar12 = (double *)(local_78 + 8);
              dVar23 = local_a8;
              dVar22 = local_d8.y;
LAB_005a4a17:
              *pdVar12 = local_d8.y;
              uVar27 = SUB84(dVar23,0);
              uVar19 = (undefined4)((ulong)dVar23 >> 0x20);
            }
            if (local_b8 <= local_d8.z) {
              pdVar12 = local_88;
              dVar23 = local_d8.z;
              dVar25 = local_b0;
              if (local_b0 < local_d8.z) goto LAB_005a4a49;
            }
            else {
              pdVar12 = local_68;
              uVar26 = SUB84(local_d8.z,0);
              uVar17 = (undefined4)((ulong)local_d8.z >> 0x20);
              dVar23 = local_b0;
LAB_005a4a49:
              *pdVar12 = local_d8.z;
              dVar25 = dVar23;
            }
            local_d8.x = pOVar5[*piVar15].x;
            local_d8.y = pOVar5[*piVar15].y;
            local_d8.z = pOVar5[*piVar15].z;
            if (dVar24 <= local_d8.x) {
              if (dVar21 < local_d8.x) {
                local_98 = (undefined1  [8])local_d8.x;
              }
            }
            else {
              local_78 = (undefined1  [8])local_d8.x;
            }
            pdVar12 = (double *)(local_78 + 8);
            if ((local_d8.y < dVar22) ||
               (pdVar12 = pdVar13,
               (double)CONCAT44(uVar19,uVar27) <= local_d8.y &&
               local_d8.y != (double)CONCAT44(uVar19,uVar27))) {
              *pdVar12 = local_d8.y;
            }
            pdVar12 = local_68;
            if ((local_d8.z <= (double)CONCAT44(uVar17,uVar26) &&
                 (double)CONCAT44(uVar17,uVar26) != local_d8.z) ||
               (pdVar12 = local_88, dVar25 < local_d8.z)) {
              *pdVar12 = local_d8.z;
            }
          }
          bVar10 = Insert(this,(double *)local_78,(double *)local_98,(int)uVar16);
          if (!bVar10) {
            this->m_root = (ON_RTreeNode *)0x0;
            pBVar14 = (this->m_mem_pool).m_blk_list;
            if (pBVar14 != (Blk *)0x0) {
              (this->m_mem_pool).m_blk_list = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_blk = 0;
              (this->m_mem_pool).m_buffer = (uchar *)0x0;
              (this->m_mem_pool).m_buffer_capacity = 0;
              (this->m_mem_pool).m_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_heap = 0;
              do {
                pBVar2 = pBVar14->m_next;
                onfree(pBVar14);
                pBVar14 = pBVar2;
              } while (pBVar2 != (Blk *)0x0);
              return false;
            }
            goto LAB_005a517d;
          }
          uVar16 = uVar16 + 1;
          piVar15 = piVar15 + 4;
        } while (local_38 != uVar16);
      }
    }
    else {
      if (pOVar4 == (ON_3fPoint *)0x0) goto LAB_005a517d;
LAB_005a4b09:
      piVar15 = pOVar3->vi + 3;
      uVar16 = 0;
      do {
        ON_3dPoint::operator=(&local_d8,pOVar4 + ((ON_MeshFace *)(piVar15 + -3))->vi[0]);
        local_48 = local_d8.x;
        dStack_40 = local_d8.y;
        dStack_90 = local_d8.y;
        local_98 = (undefined1  [8])local_d8.x;
        dStack_70 = local_d8.y;
        local_78 = (undefined1  [8])local_d8.x;
        local_88[0] = local_d8.z;
        local_58 = local_d8.z;
        local_68[0] = local_d8.z;
        ON_3dPoint::operator=(&local_d8,pOVar4 + piVar15[-2]);
        dVar21 = local_58;
        if (local_48 <= local_d8.x) {
          if (local_d8.x <= local_48) {
            local_a0 = local_48;
            goto LAB_005a4bc3;
          }
          local_b0 = local_d8.x;
          local_98 = (undefined1  [8])local_d8.x;
          local_a0 = local_48;
        }
        else {
          local_78 = (undefined1  [8])local_d8.x;
          local_a0 = local_d8.x;
LAB_005a4bc3:
          local_b0 = local_48;
        }
        uVar17 = SUB84(local_58,0);
        uVar19 = (undefined4)((ulong)local_58 >> 0x20);
        if (dStack_40 <= local_d8.y) {
          puVar7 = local_98;
          dVar24 = local_d8.y;
          dVar23 = dStack_40;
          local_a8 = dStack_40;
          if (dStack_40 < local_d8.y) goto LAB_005a4c04;
        }
        else {
          puVar7 = local_78;
          dVar24 = dStack_40;
          dStack_40 = local_d8.y;
          dVar23 = 0.0;
LAB_005a4c04:
          *(double *)(puVar7 + 8) = local_d8.y;
          local_a8 = dVar24;
        }
        if (dVar21 <= local_d8.z) {
          pdVar13 = local_88;
          dVar24 = local_d8.z;
          if (dVar21 < local_d8.z) goto LAB_005a4c48;
        }
        else {
          local_58 = local_d8.z;
          pdVar13 = local_68;
          dVar24 = dVar21;
LAB_005a4c48:
          *pdVar13 = local_d8.z;
          uVar17 = SUB84(dVar24,0);
          uVar19 = (undefined4)((ulong)dVar24 >> 0x20);
        }
        local_b8 = (double)CONCAT44(uVar19,uVar17);
        local_48 = dStack_40;
        dStack_40 = dVar23;
        ON_3dPoint::operator=(&local_d8,pOVar4 + piVar15[-1]);
        dVar21 = local_58;
        uVar17 = (undefined4)((ulong)local_58 >> 0x20);
        if (local_a0 <= local_d8.x) {
          if (local_b0 < local_d8.x) {
            local_98 = (undefined1  [8])local_d8.x;
            local_b0 = local_d8.x;
          }
        }
        else {
          local_78 = (undefined1  [8])local_d8.x;
          local_a0 = local_d8.x;
        }
        uVar19 = SUB84(local_58,0);
        if (local_48 <= local_d8.y) {
          puVar7 = local_98;
          dVar24 = local_d8.y;
          dVar23 = local_48;
          dVar22 = dStack_40;
          dVar25 = local_a8;
          if (local_a8 < local_d8.y) goto LAB_005a4d05;
        }
        else {
          puVar7 = local_78;
          dVar24 = local_a8;
          dVar23 = local_d8.y;
          dVar22 = 0.0;
LAB_005a4d05:
          *(double *)(puVar7 + 8) = local_d8.y;
          dVar25 = dVar24;
        }
        if (dVar21 <= local_d8.z) {
          pdVar13 = local_88;
          dVar21 = local_d8.z;
          dVar24 = local_b8;
          if (local_b8 < local_d8.z) goto LAB_005a4d35;
        }
        else {
          uVar19 = SUB84(local_d8.z,0);
          uVar17 = (undefined4)((ulong)local_d8.z >> 0x20);
          pdVar13 = local_68;
          dVar21 = local_b8;
LAB_005a4d35:
          *pdVar13 = local_d8.z;
          dVar24 = dVar21;
        }
        if (piVar15[-1] != *piVar15) {
          local_58 = (double)CONCAT44(uVar17,uVar19);
          local_b8 = dVar24;
          local_a8 = dVar25;
          local_48 = dVar23;
          dStack_40 = dVar22;
          ON_3dPoint::operator=(&local_d8,pOVar4 + *piVar15);
          dVar21 = local_58;
          if (local_a0 <= local_d8.x) {
            if (local_b0 < local_d8.x) {
              local_98 = (undefined1  [8])local_d8.x;
            }
          }
          else {
            local_78 = (undefined1  [8])local_d8.x;
          }
          puVar7 = local_78;
          if ((local_d8.y < local_48) || (puVar7 = local_98, local_a8 < local_d8.y)) {
            *(double *)(puVar7 + 8) = local_d8.y;
          }
          pdVar13 = local_68;
          if ((local_d8.z < dVar21) || (pdVar13 = local_88, local_b8 < local_d8.z)) {
            *pdVar13 = local_d8.z;
          }
        }
        bVar10 = Insert(this,(double *)local_78,(double *)local_98,(int)uVar16);
        if (!bVar10) {
          this->m_root = (ON_RTreeNode *)0x0;
          pBVar14 = (this->m_mem_pool).m_blk_list;
          if (pBVar14 != (Blk *)0x0) {
            (this->m_mem_pool).m_blk_list = (Blk *)0x0;
            (this->m_mem_pool).m_sizeof_blk = 0;
            (this->m_mem_pool).m_buffer = (uchar *)0x0;
            (this->m_mem_pool).m_buffer_capacity = 0;
            (this->m_mem_pool).m_nodes = (Blk *)0x0;
            (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
            (this->m_mem_pool).m_sizeof_heap = 0;
            do {
              pBVar2 = pBVar14->m_next;
              onfree(pBVar14);
              pBVar14 = pBVar2;
            } while (pBVar2 != (Blk *)0x0);
          }
          goto LAB_005a517d;
        }
        uVar16 = uVar16 + 1;
        piVar15 = piVar15 + 4;
      } while (local_38 != uVar16);
    }
    bVar10 = this->m_root != (ON_RTreeNode *)0x0;
  }
  return bVar10;
}

Assistant:

bool ON_RTree::CreateMeshFaceTree( const ON_Mesh* mesh )
{
  double fmin[3], fmax[3];
  ON_3dPoint V;
  unsigned int fi, fcount;
  const int* fvi;
  const ON_MeshFace* meshF;
  const ON_3fPoint* meshfV;
  const ON_3dPoint* meshdV;

  RemoveAll();

  if ( 0 == mesh )
    return false;

  fcount = mesh->m_F.UnsignedCount();
  if ( fcount <= 0 )
    return false;

  meshF = mesh->m_F.Array();
  if ( 0 == meshF )
    return false;

  meshfV = mesh->m_V.Array();

  meshdV = mesh->HasDoublePrecisionVertices() 
         ? mesh->DoublePrecisionVertices().Array() 
         : 0;

  if ( 0 != meshfV )
  {
    if ( 0 != meshdV )
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;
        V = meshdV[fvi[0]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
          V = meshdV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
    else
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
  }
  else if ( 0 != meshdV )
  {
    for ( fi = 0; fi < fcount; fi++ )
    {
      fvi = meshF[fi].vi;

      V = meshdV[fvi[0]];
      fmin[0] = fmax[0] = V.x;
      fmin[1] = fmax[1] = V.y;
      fmin[2] = fmax[2] = V.z;

      V = meshdV[fvi[1]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      V = meshdV[fvi[2]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      if ( fvi[2] != fvi[3] )
      {
        V = meshdV[fvi[3]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
      }

      if ( !Insert(fmin,fmax,fi) )
      {
        RemoveAll();
        return false;
      }
    }
  }
  else
  {
    // no vertices
    return false;
  }

  return (0 != m_root);
}